

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O0

void __thiscall smf::MidiEvent::linkEvent(MidiEvent *this,MidiEvent *mev)

{
  MidiEvent *mev_local;
  MidiEvent *this_local;
  
  if (mev->m_eventlink != (MidiEvent *)0x0) {
    unlinkEvent(mev);
  }
  if (this->m_eventlink != (MidiEvent *)0x0) {
    unlinkEvent(this->m_eventlink);
  }
  unlinkEvent(this);
  mev->m_eventlink = this;
  this->m_eventlink = mev;
  return;
}

Assistant:

void MidiEvent::linkEvent(MidiEvent* mev) {
	if (mev->m_eventlink != NULL) {
		// unlink other event if it is linked to something else;
		mev->unlinkEvent();
	}
	// if this is already linked to something else, then unlink:
	if (m_eventlink != NULL) {
		m_eventlink->unlinkEvent();
	}
	unlinkEvent();

	mev->m_eventlink = this;
	m_eventlink = mev;
}